

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.h
# Opt level: O2

void __thiscall draco::PlyElement::AddProperty(PlyElement *this,PlyProperty *prop)

{
  pointer pPVar1;
  pointer pPVar2;
  mapped_type *pmVar3;
  
  pPVar1 = (this->properties_).
           super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar2 = (this->properties_).
           super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>._M_impl.
           super__Vector_impl_data._M_start;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->property_index_,&prop->name_);
  *pmVar3 = (mapped_type)(((long)pPVar1 - (long)pPVar2) / 0x60);
  std::vector<draco::PlyProperty,std::allocator<draco::PlyProperty>>::
  emplace_back<draco::PlyProperty_const&>
            ((vector<draco::PlyProperty,std::allocator<draco::PlyProperty>> *)&this->properties_,
             prop);
  pPVar1 = (this->properties_).
           super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar1[-1].list_data_type_ != DT_INVALID) {
    return;
  }
  PlyProperty::ReserveData(pPVar1 + -1,(int)this->num_entries_);
  return;
}

Assistant:

void AddProperty(const PlyProperty &prop) {
    property_index_[prop.name()] = static_cast<int>(properties_.size());
    properties_.emplace_back(prop);
    if (!properties_.back().is_list()) {
      properties_.back().ReserveData(static_cast<int>(num_entries_));
    }
  }